

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseRoot(Parser *this,char *source,char **include_paths,char *source_filename)

{
  StructDef *this_00;
  EnumVal *__rhs;
  bool bVar1;
  reference ppSVar2;
  size_type_conflict sVar3;
  reference ppFVar4;
  iterator __position;
  type __rhs_00;
  reference ppEVar5;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar6;
  reference ppEVar7;
  char *in_R8;
  BaseType *local_2a0;
  undefined1 local_262 [2];
  undefined1 local_260 [6];
  CheckedError err;
  EnumVal *val;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_230;
  const_iterator val_it;
  EnumDef *enum_def_1;
  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_218;
  iterator it_1;
  undefined1 local_1f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> err_1;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  BaseType *local_d0;
  BaseType *bt;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_b8;
  iterator field_it;
  StructDef *sd;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_a0;
  iterator struct_it;
  undefined1 local_90 [4];
  int initial_count;
  string qualified_name;
  size_t components;
  EnumDef *enum_def;
  StructDef *struct_def;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_50;
  iterator it;
  char *source_filename_local;
  char **include_paths_local;
  char *source_local;
  Parser *this_local;
  CheckedError *ce;
  
  DoParse(this,source,include_paths,source_filename,in_R8);
  it._M_current._0_1_ = CheckedError::Check((CheckedError *)this);
  it._M_current._1_3_ = 0;
  if (!it._M_current._0_1_) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if ((uint)it._M_current != 0) goto LAB_00148d78;
  local_50._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *)
                  (source + 0xd8));
  while( true ) {
    struct_def = (StructDef *)
                 std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 end((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *)
                     (source + 0xd8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)&struct_def);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_50);
    this_00 = *ppSVar2;
    if ((this_00->predecl & 1U) == 0) {
      __gnu_cxx::
      __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
      ::operator++(&local_50);
    }
    else {
      if ((source[0x3f9] & 1U) == 0) {
LAB_0014896b:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,"type referenced but not defined (check namespace): ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
        ;
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this_00->original_location);
        if (bVar1) {
          __rhs_00 = std::
                     unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(&this_00->original_location);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                         ", originally at: ",__rhs_00);
          std::__cxx11::string::operator+=((string *)local_1f0,(string *)&it_1);
          std::__cxx11::string::~string((string *)&it_1);
        }
        Error(this,(string *)source);
        it._M_current._0_4_ = 1;
        std::__cxx11::string::~string((string *)local_1f0);
        goto LAB_00148d78;
      }
      components = 0;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&((this_00->super_Definition).defined_namespace)->components);
      for (qualified_name.field_2._8_8_ = sVar3 + 1;
          qualified_name.field_2._8_8_ != 0 && components == 0;
          qualified_name.field_2._8_8_ = qualified_name.field_2._8_8_ + -1) {
        Namespace::GetFullyQualifiedName
                  ((string *)local_90,(this_00->super_Definition).defined_namespace,
                   (string *)this_00,qualified_name.field_2._8_8_ - 1);
        components = (size_t)LookupEnum((Parser *)source,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
      }
      if (components == 0) goto LAB_0014896b;
      struct_it._M_current._4_4_ = (this_00->super_Definition).refcount;
      local_a0._M_current =
           (StructDef **)
           std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                     ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *
                      )(source + 0xd8));
      while( true ) {
        sd = (StructDef *)
             std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::end
                       ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                         *)(source + 0xd8));
        bVar1 = __gnu_cxx::operator!=
                          (&local_a0,
                           (__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                            *)&sd);
        if (!bVar1) break;
        ppSVar2 = __gnu_cxx::
                  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                  ::operator*(&local_a0);
        field_it._M_current = (FieldDef **)*ppSVar2;
        local_b8._M_current =
             (FieldDef **)
             std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (&(((StructDef *)field_it._M_current)->fields).vec);
        while( true ) {
          field = (FieldDef *)
                  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                  end((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      (field_it._M_current + 0x1f));
          bVar1 = __gnu_cxx::operator!=
                            (&local_b8,
                             (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                              *)&field);
          if (!bVar1) break;
          ppFVar4 = __gnu_cxx::
                    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                    ::operator*(&local_b8);
          bt = (BaseType *)*ppFVar4;
          if ((((FieldDef *)bt)->value).type.struct_def == this_00) {
            (((FieldDef *)bt)->value).type.struct_def = (StructDef *)0x0;
            (((FieldDef *)bt)->value).type.enum_def = (EnumDef *)components;
            bVar1 = IsVector(&(((FieldDef *)bt)->value).type);
            if (bVar1) {
              local_2a0 = bt + 0x33;
            }
            else {
              local_2a0 = bt + 0x32;
            }
            local_d0 = local_2a0;
            if (*local_2a0 != BASE_TYPE_STRUCT) {
              __assert_fail("bt == BASE_TYPE_STRUCT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                            ,0xdd3,
                            "CheckedError flatbuffers::Parser::ParseRoot(const char *, const char **, const char *)"
                           );
            }
            *local_2a0 = *(BaseType *)(components + 0xd0);
            (this_00->super_Definition).refcount = (this_00->super_Definition).refcount + -1;
            *(int *)(components + 0xb8) = *(int *)(components + 0xb8) + 1;
          }
          __gnu_cxx::
          __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
          ::operator++(&local_b8);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
        ::operator++(&local_a0);
      }
      if ((this_00->super_Definition).refcount != 0) {
        NumToString<int>(&local_190,(this_00->super_Definition).refcount);
        std::operator+(&local_170,"internal: ",&local_190);
        std::operator+(&local_150,&local_170,"/");
        NumToString<int>(&local_1b0,struct_it._M_current._4_4_);
        std::operator+(&local_130,&local_150,&local_1b0);
        std::operator+(&local_110,&local_130," use(s) of pre-declaration enum not accounted for: ");
        std::operator+(&local_f0,&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       components);
        Error(this,(string *)source);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        goto LAB_00148d78;
      }
      __position = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                           *)(source + 0xa8),(key_type *)this_00);
      std::
      map<std::__cxx11::string,flatbuffers::StructDef*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
      ::erase_abi_cxx11_((map<std::__cxx11::string,flatbuffers::StructDef*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
                          *)(source + 0xa8),__position);
      __gnu_cxx::
      __normal_iterator<flatbuffers::StructDef*const*,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>
      ::__normal_iterator<flatbuffers::StructDef**>
                ((__normal_iterator<flatbuffers::StructDef*const*,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>
                  *)(err_1.field_2._M_local_buf + 8),&local_50);
      local_50._M_current =
           (StructDef **)
           std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::erase
                     ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *
                      )(source + 0xd8),(const_iterator)err_1.field_2._8_8_);
      if (this_00 != (StructDef *)0x0) {
        StructDef::~StructDef(this_00);
        operator_delete(this_00,0x148);
      }
    }
  }
  local_218._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 ((vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *)
                  (source + 0x120));
  while( true ) {
    enum_def_1 = (EnumDef *)
                 std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                           ((vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                             *)(source + 0x120));
    bVar1 = __gnu_cxx::operator!=
                      (&local_218,
                       (__normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)&enum_def_1);
    if (!bVar1) break;
    ppEVar5 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_218);
    val_it._M_current = (EnumVal **)*ppEVar5;
    if ((((EnumDef *)val_it._M_current)->is_union & 1U) != 0) {
      pvVar6 = EnumDef::Vals((EnumDef *)val_it._M_current);
      local_230._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar6);
      while( true ) {
        pvVar6 = EnumDef::Vals((EnumDef *)val_it._M_current);
        val = (EnumVal *)
              std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                        (pvVar6);
        bVar1 = __gnu_cxx::operator!=
                          (&local_230,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&val);
        if (!bVar1) break;
        ppEVar7 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_230);
        __rhs = *ppEVar7;
        if (((*(long *)(source + 0x680) == 0) ||
            (bVar1 = SupportsAdvancedUnionFeatures((Parser *)source), !bVar1)) &&
           ((bVar1 = IsStruct(&__rhs->union_type), bVar1 ||
            (bVar1 = IsString(&__rhs->union_type), bVar1)))) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_260,"only tables can be union elements in the generated language: ",
                         &__rhs->name);
          Error(this,(string *)source);
          std::__cxx11::string::~string((string *)local_260);
          goto LAB_00148d78;
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_230);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_218);
  }
  CheckPrivateLeak((Parser *)local_262);
  bVar1 = CheckedError::Check((CheckedError *)local_262);
  if (bVar1) {
    CheckedError::CheckedError((CheckedError *)this,(CheckedError *)local_262);
    it._M_current._0_4_ = 1;
  }
  else {
    if (*(int *)(source + 0x1c) == 0x7b) {
      DoParseJson(this);
      it._M_current._0_1_ = CheckedError::Check((CheckedError *)this);
      it._M_current._1_3_ = 0;
      if (!it._M_current._0_1_) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if ((uint)it._M_current != 0) goto LAB_00148d5c;
    }
    anon_unknown_0::NoError();
    it._M_current._0_4_ = 1;
  }
LAB_00148d5c:
  CheckedError::~CheckedError((CheckedError *)local_262);
LAB_00148d78:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseRoot(const char *source, const char **include_paths,
                               const char *source_filename) {
  ECHECK(DoParse(source, include_paths, source_filename, nullptr));

  // Check that all types were defined.
  for (auto it = structs_.vec.begin(); it != structs_.vec.end();) {
    auto &struct_def = **it;
    if (struct_def.predecl) {
      if (opts.proto_mode) {
        // Protos allow enums to be used before declaration, so check if that
        // is the case here.
        EnumDef *enum_def = nullptr;
        for (size_t components =
                 struct_def.defined_namespace->components.size() + 1;
             components && !enum_def; components--) {
          auto qualified_name =
              struct_def.defined_namespace->GetFullyQualifiedName(
                  struct_def.name, components - 1);
          enum_def = LookupEnum(qualified_name);
        }
        if (enum_def) {
          // This is pretty slow, but a simple solution for now.
          auto initial_count = struct_def.refcount;
          for (auto struct_it = structs_.vec.begin();
               struct_it != structs_.vec.end(); ++struct_it) {
            auto &sd = **struct_it;
            for (auto field_it = sd.fields.vec.begin();
                 field_it != sd.fields.vec.end(); ++field_it) {
              auto &field = **field_it;
              if (field.value.type.struct_def == &struct_def) {
                field.value.type.struct_def = nullptr;
                field.value.type.enum_def = enum_def;
                auto &bt = IsVector(field.value.type)
                               ? field.value.type.element
                               : field.value.type.base_type;
                FLATBUFFERS_ASSERT(bt == BASE_TYPE_STRUCT);
                bt = enum_def->underlying_type.base_type;
                struct_def.refcount--;
                enum_def->refcount++;
              }
            }
          }
          if (struct_def.refcount)
            return Error("internal: " + NumToString(struct_def.refcount) + "/" +
                         NumToString(initial_count) +
                         " use(s) of pre-declaration enum not accounted for: " +
                         enum_def->name);
          structs_.dict.erase(structs_.dict.find(struct_def.name));
          it = structs_.vec.erase(it);
          delete &struct_def;
          continue;  // Skip error.
        }
      }
      auto err = "type referenced but not defined (check namespace): " +
                 struct_def.name;
      if (struct_def.original_location)
        err += ", originally at: " + *struct_def.original_location;
      return Error(err);
    }
    ++it;
  }

  // This check has to happen here and not earlier, because only now do we
  // know for sure what the type of these are.
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto &enum_def = **it;
    if (enum_def.is_union) {
      for (auto val_it = enum_def.Vals().begin();
           val_it != enum_def.Vals().end(); ++val_it) {
        auto &val = **val_it;

        if (!(opts.lang_to_generate != 0 && SupportsAdvancedUnionFeatures()) &&
            (IsStruct(val.union_type) || IsString(val.union_type)))

          return Error(
              "only tables can be union elements in the generated language: " +
              val.name);
      }
    }
  }

  auto err = CheckPrivateLeak();
  if (err.Check()) return err;

  // Parse JSON object only if the scheme has been parsed.
  if (token_ == '{') { ECHECK(DoParseJson()); }
  return NoError();
}